

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  undefined1 auVar5 [16];
  slot_type *psVar6;
  slot_type *psVar7;
  slot_type *in_RSI;
  iterator iVar8;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
LAB_00226e39:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_00226e39;
    if (-1 < (char)*pcVar1) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::iterator::operator*((iterator *)this);
  psVar2 = *(slot_type **)this;
  if ((psVar2 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar2)) {
    psVar3 = *(slot_type **)in_RSI;
    if ((psVar3 == (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
         psVar3 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar3)) {
      if (psVar2 == (slot_type *)
                    absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
          psVar3 == (slot_type *)
                    absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_00226f13:
        return (reference)CONCAT71((int7)((ulong)psVar2 >> 8),psVar2 == psVar3);
      }
      if ((psVar2 ==
          (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
          (psVar3 ==
          (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
      goto LAB_00226f2f;
      if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_00226f13;
      if ((psVar3 == (slot_type *)&kSooControl) == (psVar2 == (slot_type *)&kSooControl)) {
        this = (iterator *)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)this + 8))->slot_;
        psVar4 = ((anon_union_8_1_a8a14541_for_iterator_2 *)((long)in_RSI + 8))->slot_;
        if (psVar2 == (slot_type *)&kSooControl) {
          if ((slot_type *)this == psVar4) goto LAB_00226f13;
        }
        else {
          psVar7 = psVar4;
          psVar6 = psVar3;
          in_RSI = (slot_type *)this;
          if (psVar3 < psVar2) {
            psVar7 = (slot_type *)this;
            psVar6 = psVar2;
            in_RSI = psVar4;
          }
          if ((psVar6 < in_RSI) && (in_RSI <= psVar7)) goto LAB_00226f13;
        }
      }
      container_internal::operator==();
      goto LAB_00226f25;
    }
  }
  else {
LAB_00226f25:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_00226f2f:
  container_internal::operator==();
  AssertHashEqConsistent<int>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,&in_RSI->key);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)(in_RSI->value).first;
  iVar8 = find_non_soo<int>((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,&in_RSI->key,
                            SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                            SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0));
  return (reference)iVar8.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }